

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Memory * __thiscall wasm::WasmBinaryReader::getMemory(WasmBinaryReader *this,Index index)

{
  size_type sVar1;
  reference this_00;
  pointer pMVar2;
  allocator<char> local_39;
  string local_38;
  uint local_14;
  WasmBinaryReader *pWStack_10;
  Index index_local;
  WasmBinaryReader *this_local;
  
  local_14 = index;
  pWStack_10 = this;
  sVar1 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::size(&this->wasm->memories);
  if (index < sVar1) {
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[](&this->wasm->memories,(ulong)local_14);
    pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::get(this_00);
    return pMVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Memory index out of range.",&local_39);
  throwError(this,&local_38);
}

Assistant:

Memory* WasmBinaryReader::getMemory(Index index) {
  if (index < wasm.memories.size()) {
    return wasm.memories[index].get();
  }
  throwError("Memory index out of range.");
}